

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortConnection * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
          (BumpAllocator *this,MultiPortSymbol *args)

{
  PortConnection *pPVar1;
  
  pPVar1 = (PortConnection *)allocate(this,0x38,8);
  pPVar1->port = &args->super_Symbol;
  pPVar1->useDefault = false;
  pPVar1->isImplicit = false;
  pPVar1->connectedSymbol = (Symbol *)0x0;
  pPVar1->expr = (Expression *)0x0;
  pPVar1->modport = (ModportSymbol *)0x0;
  (pPVar1->field_4).exprSyntax = (ExpressionSyntax *)0x0;
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }